

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap
          (DictionaryPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *sorted_global_dict)

{
  bool bVar1;
  mapped_type *this_00;
  uint uVar2;
  _Base_ptr p_Var3;
  TemplateString *ts;
  TemplateString *ts_00;
  const_iterator it;
  TemplateString key;
  const_iterator local_a0;
  TemplateDictionaryInterface local_90;
  UnsafeArena *local_88;
  string local_70;
  string local_50;
  
  Mutex::ReaderLock((Mutex *)g_static_mutex);
  uVar2 = *global_dict_;
  local_a0.hash_iter_._M_node = (_Base_ptr)0x0;
  if ((int)uVar2 < 0) {
    local_a0.hash_iter_._M_node = *(_Base_ptr *)(global_dict_ + 8);
    local_a0.array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
  }
  else {
    local_a0.array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
         (global_dict_ + 2);
  }
  while( true ) {
    local_88 = (UnsafeArena *)(global_dict_ + 4);
    local_90._vptr_TemplateDictionaryInterface = (_func_int **)(UnsafeArena *)0x0;
    if (-1 < (int)uVar2) {
      local_88 = (UnsafeArena *)0x0;
      local_90._vptr_TemplateDictionaryInterface =
           (_func_int **)(global_dict_ + (ulong)uVar2 * 10 + 2);
    }
    bVar1 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
            ::const_iterator::operator!=(&local_a0,(const_iterator *)&local_90);
    if (!bVar1) {
      Mutex::ReaderUnlock((Mutex *)g_static_mutex);
      return;
    }
    p_Var3 = local_a0.hash_iter_._M_node + 1;
    if ((_Base_ptr)local_a0.array_iter_ != (_Base_ptr)0x0) {
      p_Var3 = (_Base_ptr)local_a0.array_iter_;
    }
    TemplateString::IdToString((TemplateString *)&local_90,*(TemplateId *)p_Var3);
    if (local_90._vptr_TemplateDictionaryInterface == (_func_int **)0x0) break;
    p_Var3 = local_a0.hash_iter_._M_node + 1;
    if ((_Base_ptr)local_a0.array_iter_ != (_Base_ptr)0x0) {
      p_Var3 = (_Base_ptr)local_a0.array_iter_;
    }
    PrintableTemplateString_abi_cxx11_(&local_50,(TemplateDictionary *)&p_Var3->_M_parent,ts);
    PrintableTemplateString_abi_cxx11_(&local_70,(TemplateDictionary *)&local_90,ts_00);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](sorted_global_dict,&local_70);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
    ::const_iterator::operator++(&local_a0);
    uVar2 = *global_dict_;
  }
  __assert_fail("!InvalidTemplateString(key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x2d6,
                "void ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap(map<string, string> *)"
               );
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
      ReaderMutexLock ml(&g_static_mutex);
      for (GlobalDict::const_iterator it = global_dict_->begin();
           it != global_dict_->end(); ++it) {
        const TemplateString key = TemplateDictionary::IdToString(it->first);
        assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
        (*sorted_global_dict)[PrintableTemplateString(key)] =
            PrintableTemplateString(it->second);
      }
  }